

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O2

void __thiscall xercesc_4_0::WFXMLScanner::scanEndTag(WFXMLScanner *this,bool *gotData)

{
  ReaderMgr *this_00;
  uint uVar1;
  XMLSize_t XVar2;
  XMLDocumentHandler *pXVar3;
  bool bVar4;
  uint *puVar5;
  StackElem *pSVar6;
  XMLCh *pXVar7;
  RuntimeException *this_01;
  
  *gotData = true;
  XVar2 = (this->super_XMLScanner).fElemStack.fStackTop;
  if (XVar2 == 0) {
    XMLScanner::emitError(&this->super_XMLScanner,MoreEndThanStartTags);
    ReaderMgr::skipPastChar(&(this->super_XMLScanner).fReaderMgr,L'>');
    this_01 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (this_01,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/WFXMLScanner.cpp"
               ,0x29f,Scan_UnbalancedStartEnd,(this->super_XMLScanner).fMemoryManager);
    __cxa_throw(this_01,&RuntimeException::typeinfo,XMLException::~XMLException);
  }
  if ((this->super_XMLScanner).fDoNamespaces == true) {
    puVar5 = &(this->super_XMLScanner).fElemStack.fStack[XVar2 - 1]->fCurrentURI;
  }
  else {
    puVar5 = &(this->super_XMLScanner).fEmptyNamespaceId;
  }
  uVar1 = *puVar5;
  pSVar6 = ElemStack::popTop(&(this->super_XMLScanner).fElemStack);
  XVar2 = (this->super_XMLScanner).fElemStack.fStackTop;
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  pXVar7 = XMLElementDecl::getFullName(pSVar6->fThisElement);
  bVar4 = ReaderMgr::skippedStringLong(this_00,pXVar7);
  if (bVar4) {
    if (pSVar6->fReaderNum != ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum) {
      XMLScanner::emitError(&this->super_XMLScanner,PartialTagMarkupError);
    }
    ReaderMgr::skipPastSpaces(this_00);
    bVar4 = ReaderMgr::skippedChar(this_00,L'>');
    if (!bVar4) {
      pXVar7 = XMLElementDecl::getFullName(pSVar6->fThisElement);
      XMLScanner::emitError
                (&this->super_XMLScanner,UnterminatedEndTag,pXVar7,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    pXVar3 = (this->super_XMLScanner).fDocHandler;
    if (pXVar3 != (XMLDocumentHandler *)0x0) {
      (*pXVar3->_vptr_XMLDocumentHandler[6])
                (pXVar3,pSVar6->fThisElement,(ulong)uVar1,(ulong)(XVar2 == 0),
                 pSVar6->fThisElement->fElementName->fPrefix);
    }
    *gotData = XVar2 != 0;
    return;
  }
  pXVar7 = XMLElementDecl::getFullName(pSVar6->fThisElement);
  XMLScanner::emitError
            (&this->super_XMLScanner,ExpectedEndOfTagX,pXVar7,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0
            );
  ReaderMgr::skipPastChar(this_00,L'>');
  return;
}

Assistant:

void WFXMLScanner::scanEndTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the end of the root element.
    gotData = true;

    //  Check if the element stack is empty. If so, then this is an unbalanced
    //  element (i.e. more ends than starts, perhaps because of bad text
    //  causing one to be skipped.)
    if (fElemStack.isEmpty())
    {
        emitError(XMLErrs::MoreEndThanStartTags);
        fReaderMgr.skipPastChar(chCloseAngle);
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Scan_UnbalancedStartEnd, fMemoryManager);
    }

    //  Pop the stack of the element we are supposed to be ending. Remember
    //  that we don't own this. The stack just keeps them and reuses them.
    unsigned int uriId = (fDoNamespaces)
        ? fElemStack.getCurrentURI() : fEmptyNamespaceId;
    const ElemStack::StackElem* topElem = fElemStack.popTop();

    // See if it was the root element, to avoid multiple calls below
    const bool isRoot = fElemStack.isEmpty();

    // Make sure that its the end of the element that we expect
    if (!fReaderMgr.skippedStringLong(topElem->fThisElement->getFullName()))
    {
        emitError
        (
            XMLErrs::ExpectedEndOfTagX
            , topElem->fThisElement->getFullName()
        );
        fReaderMgr.skipPastChar(chCloseAngle);
        return;
    }

    // Make sure we are back on the same reader as where we started
    if (topElem->fReaderNum != fReaderMgr.getCurrentReaderNum())
        emitError(XMLErrs::PartialTagMarkupError);

    // Skip optional whitespace
    fReaderMgr.skipPastSpaces();

    // Make sure we find the closing bracket
    if (!fReaderMgr.skippedChar(chCloseAngle))
    {
        emitError
        (
            XMLErrs::UnterminatedEndTag
            , topElem->fThisElement->getFullName()
        );
    }

    // If we have a doc handler, tell it about the end tag
    if (fDocHandler)
    {
        fDocHandler->endElement
        (
            *topElem->fThisElement
            , uriId
            , isRoot
            , topElem->fThisElement->getElementName()->getPrefix()
        );
    }

    // If this was the root, then done with content
    gotData = !isRoot;
}